

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> *
__thiscall
rcg::System::getInterfaces
          (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
           *__return_storage_ptr__,System *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *this_00;
  int iVar1;
  GC_ERROR GVar2;
  size_t sVar3;
  string *psVar4;
  Interface *this_01;
  pointer psVar5;
  GenTLException *pGVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  undefined8 extraout_RDX_01;
  pthread_mutex_t *__mutex;
  uint32_t uVar8;
  pointer __file;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint32_t n;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> current
  ;
  size_t size;
  char tmp [256];
  uint32_t local_1b4;
  shared_ptr<const_rcg::GenTLWrapper> *local_1b0;
  vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>> *local_1a8
  ;
  string local_1a0;
  pthread_mutex_t *local_180;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_178;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  *local_158;
  size_t local_150;
  __shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  string local_138 [8];
  
  __mutex = (pthread_mutex_t *)&this->mtx;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
LAB_0010a3a4:
    pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"System::getInterfaces()","");
    GenTLException::GenTLException(pGVar6,local_138,local_1b0);
    __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
  vector(__return_storage_ptr__,&this->ilist);
  if ((this->tl != (TL_HANDLE)0x0) &&
     ((this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->ilist).
      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    local_178.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8 = (vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>>
                 *)__return_storage_ptr__;
    local_180 = __mutex;
    GVar2 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->TLUpdateInterfaceList)(this->tl,(bool8_t *)0x0,10);
    local_1b0 = &this->gentl;
    if (GVar2 != 0) goto LAB_0010a3a4;
    local_1b4 = 0;
    local_158 = &this->ilist;
    GVar2 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->TLGetNumInterfaces)(this->tl,&local_1b4);
    if (GVar2 != 0) {
      pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"System::getInterfaces()","");
      GenTLException::GenTLException(pGVar6,local_138,local_1b0);
      __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    if (local_1b4 != 0) {
      uVar8 = 0;
      do {
        memset(local_138,0,0x100);
        local_150 = 0x100;
        GVar2 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  TLGetInterfaceID)(this->tl,uVar8,(char *)local_138,&local_150);
        if (GVar2 != 0) {
          pGVar6 = (GenTLException *)__cxa_allocate_exception(0x28);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a0,"System::getInterfaces()","");
          GenTLException::GenTLException(pGVar6,&local_1a0,local_1b0);
          __cxa_throw(pGVar6,&GenTLException::typeinfo,GenTLException::~GenTLException);
        }
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        sVar3 = strlen((char *)local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a0,local_138,(long)&local_138[0]._M_dataplus._M_p + sVar3);
        uVar9 = 0xffffffff;
        if (local_178.
            super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_178.
            super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar10 = 0;
          uVar11 = 0;
          do {
            psVar4 = Interface::getID_abi_cxx11_
                               (*(Interface **)
                                 ((long)&((local_178.
                                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar10));
            __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar4->_M_string_length;
            if ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length)
               && ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                   (iVar1 = bcmp((psVar4->_M_dataplus)._M_p,local_1a0._M_dataplus._M_p,(size_t)__n),
                   iVar1 == 0)))) {
              uVar9 = (uint)uVar11;
              break;
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
            uVar9 = 0xffffffff;
          } while (uVar11 < (ulong)((long)local_178.
                                          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_178.
                                          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        if ((int)uVar9 < 0) {
          this_01 = (Interface *)operator_new(0xc0);
          std::__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::System,void>
                    (local_148,(__weak_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)this);
          Interface::Interface
                    (this_01,(shared_ptr<rcg::System> *)local_148,local_1b0,(char *)local_138);
          std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<rcg::Interface,void>
                    ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_1a0,this_01);
          std::
          vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>>::
          emplace_back<std::shared_ptr<rcg::Interface>>
                    (local_1a8,(shared_ptr<rcg::Interface> *)&local_1a0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._M_string_length);
          }
          if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
          }
        }
        else {
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::push_back((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       *)local_1a8,
                      local_178.
                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar9);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_1b4);
    }
    this_00 = local_158;
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::clear(local_158);
    __return_storage_ptr__ =
         (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          *)local_1a8;
    __file = *(pointer *)local_1a8;
    uVar7 = extraout_RDX;
    if (*(pointer *)(local_1a8 + 8) != __file) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        push_back(this_00,(value_type *)
                          ((long)&(__file->
                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar10));
        uVar11 = uVar11 + 1;
        __file = *(pointer *)__return_storage_ptr__;
        lVar10 = lVar10 + 0x10;
        uVar7 = extraout_RDX_00;
      } while (uVar11 < (ulong)((long)*(pointer *)((long)__return_storage_ptr__ + 8) - (long)__file
                               >> 4));
    }
    psVar5 = *(pointer *)__return_storage_ptr__;
    if (*(pointer *)((long)__return_storage_ptr__ + 8) != psVar5) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        Interface::open(*(Interface **)
                         ((long)&(psVar5->
                                 super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar10),(char *)__file,(int)uVar7);
        uVar11 = uVar11 + 1;
        psVar5 = *(pointer *)__return_storage_ptr__;
        lVar10 = lVar10 + 0x10;
        uVar7 = extraout_RDX_01;
      } while (uVar11 < (ulong)((long)*(pointer *)((long)__return_storage_ptr__ + 8) - (long)psVar5
                               >> 4));
    }
    std::vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
    ::~vector(&local_178);
    __mutex = local_180;
  }
  pthread_mutex_unlock(__mutex);
  return (vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          *)(vector<std::shared_ptr<rcg::Interface>,std::allocator<std::shared_ptr<rcg::Interface>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Interface> > System::getInterfaces()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::vector<std::shared_ptr<Interface> > ret=ilist;

  // ENUM-WORKAROUND: Interfaces are only enumerated once and kept open as a
  // (temporary) workaround for a bug in the Baumer GenTL layer 2.1.0 for GEV
  // that is used by default. The bug causes memory and CPU time to
  // increase on every call of TLUpdateInterfaceList().

  if (tl != 0 && ilist.size() == 0)
  {
    // get list of previously requested interfaces that are still in use

    std::vector<std::shared_ptr<Interface> > current;

/*
    for (size_t i=0; i<ilist.size(); i++)
    {
      std::shared_ptr<Interface> p=ilist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }
*/

    // update available interfaces

    if (gentl->TLUpdateInterfaceList(tl, 0, 10) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    // create list of interfaces, using either existing interfaces or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->TLGetNumInterfaces(tl, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("System::getInterfaces()", gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->TLGetInterfaceID(tl, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("System::getInterfaces()", gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Interface>(new Interface(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of interfaces for reusage on next call

    ilist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      ilist.push_back(ret[i]);
    }

    // open interfaces to avoid re-enumeration as part of ENUM-WORKAROUND

    for (size_t i=0; i<ret.size(); i++)
    {
      ret[i]->open();
    }
  }

  return ret;
}